

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

QList<QByteArray> * set_union(QList<QByteArray> *l1,QList<QByteArray> *l2)

{
  const_iterator __first2;
  const_iterator __last2;
  back_insert_iterator<QList<QByteArray>_> __result;
  QList<QByteArray> *in_RDX;
  QList<QByteArray> *in_RSI;
  QList<QByteArray> *in_RDI;
  qsizetype in_stack_00000008;
  QList<QByteArray> *result;
  QList<QByteArray> *in_stack_ffffffffffffff80;
  QList<QByteArray> *in_stack_ffffffffffffffc8;
  const_iterator in_stack_ffffffffffffffd0;
  const_iterator in_stack_ffffffffffffffd8;
  
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QByteArray>::QList((QList<QByteArray> *)0x581ef8);
  QList<QByteArray>::size(in_RSI);
  QList<QByteArray>::size(in_RDX);
  QList<QByteArray>::reserve(in_stack_ffffffffffffffc8,in_stack_00000008);
  __first2 = QList<QByteArray>::begin(in_stack_ffffffffffffff80);
  __last2 = QList<QByteArray>::end(in_stack_ffffffffffffff80);
  __result.container = (QList<QByteArray> *)QList<QByteArray>::begin(in_stack_ffffffffffffff80);
  QList<QByteArray>::end(in_stack_ffffffffffffff80);
  std::back_inserter<QList<QByteArray>>(in_stack_ffffffffffffff80);
  std::
  set_union<QList<QByteArray>::const_iterator,QList<QByteArray>::const_iterator,std::back_insert_iterator<QList<QByteArray>>>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,__first2,__last2,__result);
  return in_RDI;
}

Assistant:

static QList<QByteArray> set_union(const QList<QByteArray> &l1, const QList<QByteArray> &l2)
{
    Q_ASSERT(isUniqueSorted(l1));
    Q_ASSERT(isUniqueSorted(l2));
    QList<QByteArray> result;
    result.reserve(l1.size() + l2.size());
    std::set_union(l1.begin(), l1.end(),
                   l2.begin(), l2.end(),
                   std::back_inserter(result));
    return result;
}